

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void ConvertPopulationCountTableToBitEstimates
               (int num_symbols,uint32_t *population_counts,uint32_t *output)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  uVar6 = 0;
  if (0 < num_symbols) {
    uVar6 = (ulong)(uint)num_symbols;
  }
  uVar5 = 0;
  uVar1 = 0;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = uVar1 + population_counts[uVar4];
    uVar5 = (uVar5 + 1) - (uint)(population_counts[uVar4] == 0);
  }
  if (uVar5 < 2) {
    memset(output,0,(long)num_symbols << 2);
    return;
  }
  if (uVar1 < 0x100) {
    uVar2 = kLog2Table[uVar1];
  }
  else {
    uVar2 = (*VP8LFastLog2Slow)(uVar1);
  }
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = population_counts[uVar4];
    if ((ulong)uVar1 < 0x100) {
      uVar3 = kLog2Table[uVar1];
    }
    else {
      uVar3 = (*VP8LFastLog2Slow)(uVar1);
    }
    output[uVar4] = uVar2 - uVar3;
  }
  return;
}

Assistant:

static void ConvertPopulationCountTableToBitEstimates(
    int num_symbols, const uint32_t population_counts[], uint32_t output[]) {
  uint32_t sum = 0;
  int nonzeros = 0;
  int i;
  for (i = 0; i < num_symbols; ++i) {
    sum += population_counts[i];
    if (population_counts[i] > 0) {
      ++nonzeros;
    }
  }
  if (nonzeros <= 1) {
    memset(output, 0, num_symbols * sizeof(*output));
  } else {
    const uint32_t logsum = VP8LFastLog2(sum);
    for (i = 0; i < num_symbols; ++i) {
      output[i] = logsum - VP8LFastLog2(population_counts[i]);
    }
  }
}